

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVJobServerClient.cxx
# Opt level: O0

void __thiscall anon_unknown.dwarf_35d814::ImplPosix::SendToken(ImplPosix *this)

{
  int status_00;
  uv_stream_t *handle;
  weak_ptr<std::function<void_(int)>_> local_38;
  int local_24;
  undefined1 auStack_20 [4];
  int status;
  uv_buf_t buf;
  ImplPosix *this_local;
  
  if (this->Conn != None) {
    buf.len = (size_t)this;
    _auStack_20 = uv_buf_init(&SendToken::token,1);
    handle = GetWriter(this);
    std::weak_ptr<std::function<void(int)>>::weak_ptr<std::function<void(int)>,void>
              ((weak_ptr<std::function<void(int)>> *)&local_38,&this->OnWrite);
    status_00 = ::cm::uv_write(handle,(uv_buf_t *)auStack_20,1,&local_38);
    std::weak_ptr<std::function<void_(int)>_>::~weak_ptr(&local_38);
    if (status_00 != 0) {
      local_24 = status_00;
      Disconnect(this,status_00);
    }
  }
  return;
}

Assistant:

void ImplPosix::SendToken()
{
  if (this->Conn == Connection::None) {
    return;
  }

  static char token = '.';

  uv_buf_t const buf = uv_buf_init(&token, sizeof(token));
  int status = cm::uv_write(this->GetWriter(), &buf, 1, this->OnWrite);
  if (status != 0) {
    this->Disconnect(status);
  }
}